

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error,string *cmp0115Warning)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  PolicyStatus PVar2;
  cmMakefile *this_00;
  cmake *this_01;
  string *psVar3;
  bool local_2c9;
  cmAlphaNum local_2a8;
  cmAlphaNum local_278;
  string local_248;
  reference local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmAlphaNum local_1d8;
  string local_1a8;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  undefined1 local_128 [8];
  string err;
  undefined1 local_e0 [8];
  anon_class_56_7_c6d6a0c4 findInDir;
  bool cmp0118new;
  PolicyStatus cmp0118;
  PolicyStatus cmp0115;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exts;
  string *lPath;
  cmMakefile *makefile;
  string *local_28;
  string *cmp0115Warning_local;
  string *error_local;
  cmSourceFile *this_local;
  
  local_28 = cmp0115Warning;
  cmp0115Warning_local = error;
  error_local = (string *)this;
  bVar1 = GetIsGenerated(this,GlobalAndLocal);
  if (bVar1) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)&makefile,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&makefile);
    std::__cxx11::string::~string((string *)&makefile);
    this->FindFullPathFailed = false;
    this_local._7_1_ = 1;
    goto LAB_0048fab2;
  }
  if ((this->FindFullPathFailed & 1U) != 0) {
    this_local._7_1_ = 0;
    goto LAB_0048fab2;
  }
  this_00 = cmSourceFileLocation::GetMakefile(&this->Location);
  __return_storage_ptr__ =
       &exts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)__return_storage_ptr__,&this->Location);
  this_01 = cmMakefile::GetCMakeInstance(this_00);
  cmake::GetAllExtensions_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90,this_01);
  PVar2 = cmMakefile::GetPolicyStatus(this_00,CMP0115,false);
  findInDir.makefile._4_4_ = cmMakefile::GetPolicyStatus(this_00,CMP0118,false);
  local_2c9 = WARN < findInDir.makefile._4_4_;
  findInDir.makefile._3_1_ = local_2c9;
  findInDir.this = (cmSourceFile *)local_90;
  findInDir._24_8_ = local_28;
  findInDir.cmp0115Warning._0_1_ = local_2c9;
  local_e0 = (undefined1  [8])this;
  findInDir.exts =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)__return_storage_ptr__;
  findInDir.lPath._0_4_ = PVar2;
  findInDir._40_8_ = this_00;
  bVar1 = cmSourceFileLocation::DirectoryIsAmbiguous(&this->Location);
  if (bVar1) {
    psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_e0,psVar3);
    if (!bVar1) {
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                        ((anon_class_56_7_c6d6a0c4 *)local_e0,psVar3);
      if (!bVar1) goto LAB_0048f854;
    }
    this_local._7_1_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_e0,(string *)(err.field_2._M_local_buf + 8)
                      );
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
LAB_0048f854:
      cmAlphaNum::cmAlphaNum(&local_158,"Cannot find source file:\n  ");
      cmAlphaNum::cmAlphaNum(&local_188,(string *)__return_storage_ptr__);
      cmStrCat<>((string *)local_128,&local_158,&local_188);
      if (PVar2 < NEW) {
        cmAlphaNum::cmAlphaNum(&local_1d8,(string *)local_128);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range2,"\nTried extensions");
        cmStrCat<>(&local_1a8,&local_1d8,(cmAlphaNum *)&__range2);
        std::__cxx11::string::operator=((string *)local_128,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_90);
        ext = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_90);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&ext), bVar1) {
          local_228 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          cmAlphaNum::cmAlphaNum(&local_278,(string *)local_128);
          cmAlphaNum::cmAlphaNum(&local_2a8," .");
          cmStrCat<std::__cxx11::string>(&local_248,&local_278,&local_2a8,local_228);
          std::__cxx11::string::operator=((string *)local_128,(string *)&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      if (cmp0115Warning_local == (string *)0x0) {
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_128);
      }
      else {
        std::__cxx11::string::operator=((string *)cmp0115Warning_local,(string *)local_128);
      }
      this->FindFullPathFailed = true;
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_128);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_90);
  std::__cxx11::string::~string
            ((string *)
             &exts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0048fab2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error,
                                std::string* cmp0115Warning)
{
  // If the file is generated compute the location without checking on disk.
  // Note: We also check for a locally set GENERATED property, because
  //       it might have been set before policy CMP0118 was set to NEW.
  if (this->GetIsGenerated(CheckScope::GlobalAndLocal)) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    this->FindFullPathFailed = false;
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const& lPath = this->Location.GetFullPath();
  // List of extension lists
  std::vector<std::string> exts =
    makefile->GetCMakeInstance()->GetAllExtensions();
  auto cmp0115 = makefile->GetPolicyStatus(cmPolicies::CMP0115);
  auto cmp0118 = makefile->GetPolicyStatus(cmPolicies::CMP0118);
  bool const cmp0118new =
    cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN;

  // Tries to find the file in a given directory
  auto findInDir = [this, &exts, &lPath, cmp0115, cmp0115Warning, cmp0118new,
                    makefile](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    if (cmp0118new &&
        makefile->GetGlobalGenerator()->IsGeneratedFile(fullPath)) {
      this->IsGenerated = true;
    }
    if (this->IsGenerated || cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // This has to be an if statement due to a bug in Oracle Developer Studio.
    // See https://community.oracle.com/tech/developers/discussion/4476246/
    // for details.
    if (cmp0115 == cmPolicies::OLD || cmp0115 == cmPolicies::WARN) {
      // Try full path with extension
      for (std::string const& ext : exts) {
        if (!ext.empty()) {
          std::string extPath = cmStrCat(fullPath, '.', ext);
          if (cmp0118new &&
              makefile->GetGlobalGenerator()->IsGeneratedFile(extPath)) {
            this->IsGenerated = true;
          }
          if (this->IsGenerated || cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            if (cmp0115 == cmPolicies::WARN) {
              std::string warning =
                cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0115),
                         "\nFile:\n  ", extPath);
              if (cmp0115Warning) {
                *cmp0115Warning = std::move(warning);
              } else {
                makefile->GetCMakeInstance()->IssueMessage(
                  MessageType::AUTHOR_WARNING, warning);
              }
            }
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err = cmStrCat("Cannot find source file:\n  ", lPath);
  switch (cmp0115) {
    case cmPolicies::OLD:
    case cmPolicies::WARN:
      err = cmStrCat(err, "\nTried extensions");
      for (auto const& ext : exts) {
        err = cmStrCat(err, " .", ext);
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}